

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-dump.c
# Opt level: O2

char * fy_simple_key_list_dump_format
                 (fy_parser *fyp,fy_simple_key_list *fyskl,fy_simple_key *fysk_highlight,char *buf,
                 size_t bufsz)

{
  fy_simple_key *pfVar1;
  int iVar2;
  fy_simple_key *pfVar3;
  fy_simple_key *pfVar4;
  size_t sVar5;
  char *pcVar6;
  fy_parser *fyp_00;
  char *pcVar7;
  fy_parser *__s;
  
  if (fyskl == (fy_simple_key_list *)0x0) {
    pfVar4 = (fy_simple_key *)0x0;
  }
  else {
    pfVar3 = (fy_simple_key *)(fyskl->_lh).next;
    pfVar4 = (fy_simple_key *)0x0;
    if (pfVar3 != (fy_simple_key *)fyskl) {
      pfVar4 = pfVar3;
    }
  }
  __s = (fy_parser *)buf;
  while (pfVar3 = pfVar4, pfVar3 != (fy_simple_key *)0x0) {
    if (fyskl == (fy_simple_key_list *)0x0) {
      pfVar4 = (fy_simple_key *)0x0;
    }
    else {
      pfVar1 = (fy_simple_key *)(fyskl->_lh).next;
      pfVar4 = (fy_simple_key *)0x0;
      if (pfVar1 != (fy_simple_key *)fyskl) {
        pfVar4 = pfVar1;
      }
    }
    pcVar6 = "";
    if (pfVar3 != pfVar4) {
      pcVar6 = ",";
    }
    pcVar7 = "*";
    if (pfVar3 != fysk_highlight) {
      pcVar7 = "";
    }
    fyp_00 = __s;
    iVar2 = snprintf((char *)__s,(size_t)(buf + ((bufsz - 1) - (long)__s)),"%s%s",pcVar6,pcVar7);
    pcVar6 = (char *)((long)&(__s->cfg).search_path + (long)iVar2);
    fy_simple_key_dump_format(fyp_00,pfVar3,pcVar6,(size_t)(buf + ((bufsz - 1) - (long)pcVar6)));
    sVar5 = strlen(pcVar6);
    __s = (fy_parser *)(pcVar6 + sVar5);
    pfVar4 = (fy_simple_key *)0x0;
    if ((fyskl != (fy_simple_key_list *)0x0) &&
       (pfVar4 = (fy_simple_key *)(pfVar3->node).next, pfVar4 == (fy_simple_key *)fyskl)) {
      pfVar4 = (fy_simple_key *)0x0;
    }
  }
  *(undefined1 *)&(__s->cfg).search_path = 0;
  return buf;
}

Assistant:

char *fy_simple_key_list_dump_format(struct fy_parser *fyp, struct fy_simple_key_list *fyskl,
                                     struct fy_simple_key *fysk_highlight, char *buf, size_t bufsz) {
    char *s, *e;
    struct fy_simple_key *fysk;

    s = buf;
    e = buf + bufsz - 1;
    for (fysk = fy_simple_key_list_first(fyskl); fysk; fysk = fy_simple_key_next(fyskl, fysk)) {

        s += snprintf(s, e - s, "%s%s",
                      fysk != fy_simple_key_list_first(fyskl) ? "," : "",
                      fysk_highlight == fysk ? "*" : "");

        fy_simple_key_dump_format(fyp, fysk, s, e - s);

        s += strlen(s);
    }
    *s = '\0';

    return buf;
}